

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,VectorBase<double> *param_1,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *param_4,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  VarStatus VVar5;
  int *piVar6;
  pointer pdVar7;
  pointer pdVar8;
  VarStatus *pVVar9;
  Nonzero<double> *pNVar10;
  Nonzero<double> *pNVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  VarStatus *pVVar15;
  long lVar16;
  byte bVar17;
  bool *pbVar18;
  double dVar19;
  
  if ((this->m_isLast == true) && (lVar13 = (long)(this->m_perm).thesize, 0 < lVar13)) {
    piVar6 = (this->m_perm).data;
    pdVar7 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar9 = rStatus->data;
    uVar14 = lVar13 + 1;
    do {
      lVar13 = (long)piVar6[uVar14 - 2];
      if (-1 < lVar13) {
        pdVar7[uVar14 - 2] = pdVar7[lVar13];
        pdVar8[uVar14 - 2] = pdVar8[lVar13];
        pVVar9[uVar14 - 2] = pVVar9[lVar13];
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  iVar1 = (this->m_scale).super_SVectorBase<double>.memused;
  if (0 < (long)iVar1) {
    pNVar10 = (this->m_scale).super_SVectorBase<double>.m_elem;
    iVar2 = this->m_i;
    pdVar7 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)iVar1 << 4;
    lVar16 = 0;
    do {
      iVar3 = *(int *)((long)&pNVar10->idx + lVar16);
      if (iVar3 != iVar2) {
        pdVar7[iVar3] = pdVar7[iVar2] / *(double *)((long)&pNVar10->val + lVar16);
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar13 != lVar16);
    if (0 < iVar1) {
      pNVar10 = (this->m_scale).super_SVectorBase<double>.m_elem;
      pNVar11 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
      iVar1 = this->m_i;
      pVVar9 = rStatus->data;
      iVar2 = this->m_maxLhsIdx;
      pdVar7 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = this->m_minRhsIdx;
      pbVar18 = (this->m_isLhsEqualRhs).data;
      lVar16 = 0;
      bVar17 = 0;
      do {
        iVar4 = *(int *)((long)&pNVar10->idx + lVar16);
        VVar5 = pVVar9[iVar1];
        if ((VVar5 == BASIC) || ((bool)(bVar17 & iVar4 != iVar1))) {
LAB_001fef5c:
          pdVar7[iVar4] = *(double *)((long)&pNVar11->val + lVar16);
          pVVar15 = pVVar9 + iVar4;
LAB_001fef6c:
          *pVVar15 = BASIC;
        }
        else if (VVar5 == FIXED) {
          if ((iVar4 == iVar2) || (iVar4 == this->m_minRhsIdx)) {
            pdVar7[iVar4] = pdVar7[iVar1] * *(double *)((long)&pNVar10->val + lVar16);
            pdVar7[iVar1] = this->m_i_rowObj;
            if (*pbVar18 == true) {
              pVVar9[iVar4] = FIXED;
            }
            else {
              dVar19 = *(double *)((long)&pNVar10->val + lVar16) * pNVar10->val;
              if (iVar4 == iVar2) {
                bVar12 = 0.0 < dVar19;
              }
              else {
                bVar12 = dVar19 <= 0.0;
              }
              pVVar9[iVar4] = (uint)bVar12;
            }
            goto LAB_001ff07a;
          }
LAB_001fef94:
          if (iVar4 != iVar1) goto LAB_001fef5c;
        }
        else {
          if ((VVar5 == ON_LOWER) && (iVar4 == iVar2)) {
            pdVar7[iVar2] = pdVar7[iVar1] * *(double *)((long)&pNVar10->val + lVar16);
            pdVar7[iVar1] = this->m_i_rowObj;
            pVVar9[iVar2] = (uint)(0.0 < *(double *)((long)&pNVar10->val + lVar16) * pNVar10->val);
          }
          else {
            if ((VVar5 != ON_UPPER) || (iVar4 != iVar3)) goto LAB_001fef94;
            pdVar7[iVar3] = pdVar7[iVar1] * *(double *)((long)&pNVar10->val + lVar16);
            pdVar7[iVar1] = this->m_i_rowObj;
            pVVar9[iVar3] = (uint)(*(double *)((long)&pNVar10->val + lVar16) * pNVar10->val <= 0.0);
          }
LAB_001ff07a:
          bVar17 = 1;
          pVVar15 = pVVar9 + iVar1;
          if (iVar4 != iVar1) goto LAB_001fef6c;
        }
        lVar16 = lVar16 + 0x10;
        pbVar18 = pbVar18 + 1;
      } while (lVar13 != lVar16);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}